

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O0

QString * __thiscall
SecurityDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  WIN_CERTIFICATE *pWVar1;
  WIN_CERTIFICATE *cert;
  size_t fieldId_local;
  SecurityDirWrapper *this_local;
  
  if (fieldId == 2) {
    pWVar1 = getCert(this);
    if (pWVar1 == (WIN_CERTIFICATE *)0x0) {
      QString::QString(__return_storage_ptr__,"");
    }
    else {
      translateType(__return_storage_ptr__,this,(uint)pWVar1->wCertificateType);
    }
  }
  else {
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateFieldContent(size_t fieldId)
{
    if (fieldId != TYPE) return "";

    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return "";

    return translateType(cert->wCertificateType);
}